

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomized_attacker_strategy.cpp
# Opt level: O3

void __thiscall
RandomizedAttackerStrategy::generateActions
          (RandomizedAttackerStrategy *this,PlayerSight *sight,Actions *actions)

{
  int *piVar1;
  iterator iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  vector<int,_std::allocator<int>_> targets;
  int local_4c;
  int *local_48;
  iterator iStack_40;
  int *local_38;
  
  if ((this->field_0xc == '\0') && (sight->canSuckAttack == true)) {
    local_48 = (int *)0x0;
    iStack_40._M_current = (int *)0x0;
    local_38 = (int *)0x0;
    local_4c = 0;
    if (0 < sight->unitInSightCount) {
      do {
        fVar6 = *(float *)(*(long *)&sight->unitInSight + 4 + (long)local_4c * 0x14) -
                (sight->pos).x;
        fVar7 = *(float *)(*(long *)&sight->unitInSight + 8 + (long)local_4c * 0x14) -
                (sight->pos).y;
        if (SQRT(fVar6 * fVar6 + fVar7 * fVar7) <= 4.0) {
          if (iStack_40._M_current == local_38) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_48,iStack_40,&local_4c);
          }
          else {
            *iStack_40._M_current = local_4c;
            iStack_40._M_current = iStack_40._M_current + 1;
          }
        }
        iVar2._M_current = iStack_40._M_current;
        piVar1 = local_48;
        local_4c = local_4c + 1;
      } while (local_4c < sight->unitInSightCount);
      if ((local_48 != iStack_40._M_current) && (local_48 + 1 != iStack_40._M_current)) {
        lVar5 = 4;
        do {
          iVar3 = rand();
          lVar4 = (long)iVar3 % ((lVar5 >> 2) + 1);
          if (lVar5 != lVar4 * 4) {
            iVar3 = *(int *)((long)piVar1 + lVar5);
            *(int *)((long)piVar1 + lVar5) = piVar1[lVar4];
            piVar1[lVar4] = iVar3;
          }
          lVar4 = lVar5 + 4;
          lVar5 = lVar5 + 4;
        } while ((int *)((long)piVar1 + lVar4) != iVar2._M_current);
      }
      if (iStack_40._M_current != local_48) {
        Actions::emplace(actions,SuckAttack,
                         *(int *)(*(long *)&sight->unitInSight + (long)*local_48 * 0x14),(Vec2)0x0);
      }
      if (local_48 != (int *)0x0) {
        operator_delete(local_48);
      }
    }
  }
  return;
}

Assistant:

void RandomizedAttackerStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    if (!sight.canSuckAttack)
        return;
    vector<int> targets;
    for (int i = 0; i < sight.unitInSightCount; ++i)
        if ((sight.unitInSight[i].pos - sight.pos).length() <= SuckRange)
            targets.push_back(i);
    random_shuffle(targets.begin(), targets.end());
	if (targets.size() > 0)
		actions->emplace(SuckAttack, sight.unitInSight[targets[0]].id, Vec2());
}